

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::dragMoveEvent(QAbstractItemView *this,QDragMoveEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  LayoutDirection LVar7;
  int iVar8;
  DragDropMode DVar9;
  DropIndicatorPosition DVar10;
  QAbstractItemView *pQVar11;
  QWidget *pQVar12;
  undefined4 uVar13;
  QModelIndex *pQVar14;
  uint *puVar15;
  ulong uVar16;
  undefined8 uVar17;
  QPoint QVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  QModelIndex local_80;
  Representation local_68;
  int iStack_64;
  uint uStack_60;
  int iStack_5c;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auVar19._0_8_ =
       (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x10);
  auVar19._8_8_ =
       (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x18);
  auVar19 = minpd(_DAT_0066f5d0,auVar19);
  auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  uVar6 = movmskpd((int)local_38,auVar20);
  uVar13 = 0x80000000;
  iVar2 = (int)auVar19._0_8_;
  if ((uVar6 & 1) == 0) {
    iVar2 = -0x80000000;
  }
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  iVar3 = (int)auVar19._8_8_;
  if ((uVar6 & 2) == 0) {
    iVar3 = -0x80000000;
  }
  pQVar12 = *(QWidget **)
             &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  LVar7 = QWidget::layoutDirection(pQVar12);
  iVar8 = (**(code **)(*(long *)pQVar12 + 0x2b0))(pQVar12);
  iVar4 = -iVar8;
  if (LVar7 != RightToLeft) {
    iVar4 = iVar8;
  }
  iVar8 = (**(code **)(*(long *)pQVar12 + 0x2b8))(pQVar12);
  QVar18.xp.m_i = iVar4 + iVar2;
  QVar18.yp.m_i = iVar8 + iVar3;
  this_00->draggedPosition = QVar18;
  DVar9 = dragDropMode(this);
  if ((DVar9 == InternalMove) &&
     ((pQVar11 = (QAbstractItemView *)QDropEvent::source(), pQVar11 != this ||
      (((byte)event[0x28] & 2) == 0)))) goto LAB_0053ecf8;
  event[0xc] = (QDragMoveEvent)0x0;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  auVar21._0_8_ =
       (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x10);
  auVar21._8_8_ =
       (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x18);
  auVar19 = minpd(_DAT_0066f5d0,auVar21);
  auVar22._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar22._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  local_80._0_8_ = ZEXT48((uint)(int)auVar19._0_8_);
  uVar6 = movmskpd(uVar13,auVar22);
  pQVar14 = (QModelIndex *)(ulong)uVar6;
  uVar16 = (ulong)(uint)(int)auVar19._8_8_ << 0x20;
  if ((uVar6 & 2) == 0) {
    uVar16 = 0x8000000000000000;
  }
  if ((uVar6 & 1) == 0) {
    local_80._0_8_ = 0x80000000;
  }
  local_80._0_8_ = local_80._0_8_ | uVar16;
  (**(code **)(*(long *)this + 0x1f0))(&local_58,this);
  QPersistentModelIndex::operator=(&this_00->hover,&local_58);
  bVar5 = QAbstractItemViewPrivate::droppingOnItself(this_00,(QDropEvent *)event,&local_58);
  uVar13 = SUB84(pQVar14,0);
  if (!bVar5) {
    bVar5 = QAbstractItemViewPrivate::canDrop(this_00,(QDropEvent *)event);
    uVar13 = SUB84(pQVar14,0);
    if (bVar5) {
      if ((((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
          (local_58.m.ptr == (QAbstractItemModel *)0x0)) || (this_00->showDropIndicator != true)) {
        (this_00->dropIndicatorRect).x1 = 0;
        (this_00->dropIndicatorRect).y1 = 0;
        (this_00->dropIndicatorRect).x2 = -1;
        (this_00->dropIndicatorRect).y2 = -1;
        this_00->dropIndicatorPosition = OnViewport;
LAB_0053ec0a:
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_80,(QPersistentModelIndex *)(*(long *)(this + 8) + 0x3b8));
        uVar16 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
        if ((uVar16 & 8) != 0) {
LAB_0053ec37:
          *(undefined4 *)(event + 0x2c) = *(undefined4 *)(event + 0x30);
          event[0xc] = (QDragMoveEvent)0x1;
        }
      }
      else {
        local_68.m_i = -0x55555556;
        iStack_64 = 0xaaaaaaaa;
        uStack_60 = 0xaaaaaaaa;
        iStack_5c = 0xaaaaaaaa;
        auVar19 = (**(code **)(*(long *)this + 0x1e0))(this,&local_58);
        local_68.m_i = auVar19._0_4_;
        iStack_64 = auVar19._4_4_;
        uStack_60 = auVar19._8_4_;
        iStack_5c = auVar19._12_4_;
        auVar23._0_8_ =
             (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x10);
        auVar23._8_8_ =
             (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(event + 0x18);
        auVar19 = minpd(_DAT_0066f5d0,auVar23);
        auVar24._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
        auVar24._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
        local_80._0_8_ = ZEXT48((uint)(int)auVar19._0_8_);
        uVar6 = movmskpd(uVar13,auVar24);
        uVar16 = (ulong)(uint)(int)auVar19._8_8_ << 0x20;
        if ((uVar6 & 2) == 0) {
          uVar16 = 0x8000000000000000;
        }
        if ((uVar6 & 1) == 0) {
          local_80._0_8_ = 0x80000000;
        }
        local_80._0_8_ = local_80._0_8_ | uVar16;
        pQVar14 = &local_58;
        DVar10 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                        super_QFramePrivate.super_QWidgetPrivate + 0x120))
                           (this_00,&local_80,&local_68);
        this_00->dropIndicatorPosition = DVar10;
        if (((this_00->selectionBehavior == SelectRows) && (DVar10 != OnViewport)) &&
           ((DVar10 != OnItem ||
            (pQVar11 = (QAbstractItemView *)QDropEvent::source(), pQVar11 == this)))) {
          if (0 < local_58.c) {
            QModelIndex::siblingAtColumn(&local_80,&local_58,0);
            auVar19 = (**(code **)(*(long *)this + 0x1e0))(this,&local_80);
            local_68.m_i = auVar19._0_4_;
            iStack_64 = auVar19._4_4_;
            uStack_60 = auVar19._8_4_;
            iStack_5c = auVar19._12_4_;
          }
          pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          uStack_60 = ~(pQVar12->data->crect).x1.m_i + (pQVar12->data->crect).x2.m_i;
          pQVar14 = (QModelIndex *)(ulong)uStack_60;
        }
        puVar15 = &switchD_0053ebb9::switchdataD_006f9a4c;
        switch(this_00->dropIndicatorPosition) {
        case OnItem:
          uVar16 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_58);
          pQVar14 = (QModelIndex *)&this_00->dropIndicatorRect;
          if ((uVar16 & 8) != 0) {
            ((QRect *)pQVar14)->x1 = (Representation)local_68.m_i;
            ((QRect *)pQVar14)->y1 = (Representation)iStack_64;
            (this_00->dropIndicatorRect).x2 = (Representation)uStack_60;
            (this_00->dropIndicatorRect).y2 = (Representation)iStack_5c;
            goto LAB_0053ec37;
          }
          ((QRect *)pQVar14)->x1 = 0;
          ((QRect *)pQVar14)->y1 = 0;
          (this_00->dropIndicatorRect).x2 = -1;
          (this_00->dropIndicatorRect).y2 = -1;
          break;
        case AboveItem:
          if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
            local_80.r = -1;
            local_80.c = -1;
            local_80.i = 0;
            local_80.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_80,local_58.m.ptr,&local_58);
          }
          uVar16 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
          if ((uVar16 & 8) != 0) {
            (this_00->dropIndicatorRect).x1.m_i = local_68.m_i;
            pQVar14 = (QModelIndex *)(ulong)(iStack_64 - 1U);
            (this_00->dropIndicatorRect).y1 = (Representation)iStack_64;
            (this_00->dropIndicatorRect).x2 = (Representation)uStack_60;
            (this_00->dropIndicatorRect).y2.m_i = iStack_64 - 1U;
            goto LAB_0053ec37;
          }
LAB_0053edff:
          (this_00->dropIndicatorRect).x1 = 0;
          (this_00->dropIndicatorRect).y1 = 0;
          (this_00->dropIndicatorRect).x2 = -1;
          (this_00->dropIndicatorRect).y2 = -1;
          pQVar14 = (QModelIndex *)puVar15;
          break;
        case BelowItem:
          if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
            local_80.r = -1;
            local_80.c = -1;
            local_80.i = 0;
            local_80.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_80,local_58.m.ptr,&local_58);
          }
          uVar16 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_80);
          if ((uVar16 & 8) == 0) goto LAB_0053edff;
          pQVar14 = (QModelIndex *)(ulong)(uint)local_68.m_i;
          (this_00->dropIndicatorRect).x1.m_i = local_68.m_i;
          (this_00->dropIndicatorRect).y1.m_i = iStack_5c;
          (this_00->dropIndicatorRect).x2.m_i = uStack_60;
          (this_00->dropIndicatorRect).y2.m_i = iStack_5c + -1;
          goto LAB_0053ec37;
        case OnViewport:
          (this_00->dropIndicatorRect).x1 = 0;
          (this_00->dropIndicatorRect).y1 = 0;
          (this_00->dropIndicatorRect).x2 = -1;
          (this_00->dropIndicatorRect).y2 = -1;
          pQVar14 = (QModelIndex *)puVar15;
          goto LAB_0053ec0a;
        }
      }
      uVar13 = SUB84(pQVar14,0);
      QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    }
  }
  auVar25._0_8_ =
       (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x10);
  auVar25._8_8_ =
       (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
       *(double *)(event + 0x18);
  auVar19 = minpd(_DAT_0066f5d0,auVar25);
  auVar26._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar26._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  uVar6 = movmskpd(uVar13,auVar26);
  uVar16 = 0x8000000000000000;
  if ((uVar6 & 2) != 0) {
    uVar16 = (ulong)(uint)(int)auVar19._8_8_ << 0x20;
  }
  local_80._0_8_ = 0x80000000;
  if ((uVar6 & 1) != 0) {
    local_80._0_8_ = (ulong)(uint)(int)auVar19._0_8_;
  }
  local_80._0_8_ = local_80._0_8_ | uVar16;
  bVar5 = QAbstractItemViewPrivate::shouldAutoScroll(this_00,(QPoint *)&local_80);
  if (bVar5) {
    lVar1 = *(long *)(this + 8);
    uVar17 = 50000000;
    if (*(int *)(lVar1 + 0x458) == 0) {
      uVar17 = 150000000;
    }
    QBasicTimer::start(lVar1 + 0x41c,uVar17,1,*(undefined8 *)(lVar1 + 8));
    *(undefined4 *)(lVar1 + 0x424) = 0;
  }
LAB_0053ecf8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QAbstractItemView);
    d->draggedPosition = event->position().toPoint() + d->offset();
    if (dragDropMode() == InternalMove
        && (event->source() != this || !(event->possibleActions() & Qt::MoveAction)))
        return;

    // ignore by default
    event->ignore();

    QModelIndex index = indexAt(event->position().toPoint());
    d->hover = index;
    if (!d->droppingOnItself(event, index)
        && d->canDrop(event)) {

        if (index.isValid() && d->showDropIndicator) {
            QRect rect = visualRect(index);
            d->dropIndicatorPosition = d->position(event->position().toPoint(), rect, index);
            if (d->selectionBehavior == QAbstractItemView::SelectRows
                && d->dropIndicatorPosition != OnViewport
                && (d->dropIndicatorPosition != OnItem || event->source() == this)) {
                if (index.column() > 0)
                    rect = visualRect(index.siblingAtColumn(0));
                rect.setWidth(viewport()->width() - 1 - rect.x());
            }
            switch (d->dropIndicatorPosition) {
            case AboveItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.top(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case BelowItem:
                if (d->isIndexDropEnabled(index.parent())) {
                    d->dropIndicatorRect = QRect(rect.left(), rect.bottom(), rect.width(), 0);
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnItem:
                if (d->isIndexDropEnabled(index)) {
                    d->dropIndicatorRect = rect;
                    event->acceptProposedAction();
                } else {
                    d->dropIndicatorRect = QRect();
                }
                break;
            case OnViewport:
                d->dropIndicatorRect = QRect();
                if (d->isIndexDropEnabled(rootIndex())) {
                    event->acceptProposedAction(); // allow dropping in empty areas
                }
                break;
            }
        } else {
            d->dropIndicatorRect = QRect();
            d->dropIndicatorPosition = OnViewport;
            if (d->isIndexDropEnabled(rootIndex())) {
                event->acceptProposedAction(); // allow dropping in empty areas
            }
        }
        d->viewport->update();
    } // can drop

    if (d->shouldAutoScroll(event->position().toPoint()))
        startAutoScroll();
}